

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_storage.c
# Opt level: O1

void * l2_storage_mem_new(l2_storage *storage_p,l2_mem_size mem_size)

{
  l2_mem_link *plVar1;
  _l2_mem_link *p_Var2;
  void *val;
  l2_mem_link *plVar3;
  int line;
  l2_storage *plVar4;
  
  plVar3 = storage_p->head_p;
  if (storage_p->head_p == (l2_mem_link *)0x0) {
    plVar3 = (l2_mem_link *)malloc(0x10);
    storage_p->head_p = plVar3;
    plVar3->next = (_l2_mem_link *)0x0;
    val = malloc(mem_size);
    plVar3->mem_p = val;
    line = 0x29;
    plVar4 = storage_p;
  }
  else {
    do {
      plVar1 = plVar3;
      plVar3 = plVar1->next;
    } while (plVar1->next != (_l2_mem_link *)0x0);
    p_Var2 = (_l2_mem_link *)malloc(0x10);
    plVar1->next = p_Var2;
    p_Var2->next = (_l2_mem_link *)0x0;
    val = malloc(mem_size);
    plVar1->next->mem_p = val;
    line = 0x22;
    plVar4 = (l2_storage *)&plVar1->next;
  }
  l2_assert_func((long)val,L2_INTERNAL_ERROR_NULL_POINTER,"l2_storage_mem_new",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_mem/l2_storage.c"
                 ,line);
  storage_p->size = storage_p->size + 1;
  return plVar4->head_p->mem_p;
}

Assistant:

void *l2_storage_mem_new(l2_storage *storage_p, l2_mem_size mem_size) {

    if (storage_p->head_p) {
        l2_mem_link *mem_link;
        for (mem_link = storage_p->head_p; mem_link->next != L2_NULL_PTR; mem_link = mem_link->next);
        mem_link->next = malloc(sizeof(l2_mem_link));
        mem_link->next->next = L2_NULL_PTR;
		l2_assert(mem_link->next->mem_p = malloc(mem_size), L2_INTERNAL_ERROR_NULL_POINTER);
        storage_p->size += 1;
        return mem_link->next->mem_p;

    } else {
        storage_p->head_p = malloc(sizeof(l2_mem_link));
        storage_p->head_p->next = L2_NULL_PTR;
		l2_assert(storage_p->head_p->mem_p = malloc(mem_size), L2_INTERNAL_ERROR_NULL_POINTER);
        storage_p->size += 1;
        return storage_p->head_p->mem_p;
    }
}